

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  size_t sVar1;
  uint unaff_retaddr;
  size_t in_stack_00000008;
  undefined4 in_stack_00000018;
  size_t in_stack_000002a0;
  void *in_stack_fffffffffffffff8;
  
  if ((int)workSpace == 0) {
    sVar1 = FSE_decompress_wksp_body_default
                      ((void *)cSrcSize,CONCAT44(maxLog,in_stack_00000018),workSpace,
                       in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_stack_000002a0);
  }
  else {
    sVar1 = FSE_decompress_wksp_body_bmi2
                      ((void *)cSrcSize,CONCAT44(maxLog,in_stack_00000018),workSpace,
                       in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,in_stack_000002a0);
  }
  return sVar1;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}